

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export-lora.cpp
# Opt level: O0

void __thiscall
lora_merge_ctx::lora_merge_ctx
          (lora_merge_ctx *this,string *base_fname,
          vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *lora_files,
          string *outfile,int n_threads)

{
  bool bVar1;
  long lVar2;
  runtime_error *this_00;
  iterator this_01;
  reference fname_00;
  undefined8 uVar3;
  string *in_RCX;
  undefined8 in_RDX;
  long in_RDI;
  undefined4 in_R8D;
  file_input *in_stack_00000098;
  lora_merge_ctx *in_stack_000000a0;
  ggml_init_params params;
  unique_ptr<file_input,_std::default_delete<file_input>_> adapter;
  float scale;
  string fname;
  common_adapter_lora_info *lora_inp;
  iterator __end1;
  iterator __begin1;
  vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *__range1;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  string local_78 [28];
  float in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  file_input *in_stack_ffffffffffffffb0;
  __normal_iterator<common_adapter_lora_info_*,_std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>_>
  local_48;
  undefined8 local_40;
  undefined4 local_24;
  string *local_20;
  undefined8 local_18;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  file_input::file_input
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  std::
  vector<std::unique_ptr<file_input,_std::default_delete<file_input>_>,_std::allocator<std::unique_ptr<file_input,_std::default_delete<file_input>_>_>_>
  ::vector((vector<std::unique_ptr<file_input,_std::default_delete<file_input>_>,_std::allocator<std::unique_ptr<file_input,_std::default_delete<file_input>_>_>_>
            *)0x179cf3);
  *(undefined4 *)(in_RDI + 0x268) = local_24;
  *(undefined8 *)(in_RDI + 0x270) = 0;
  *(undefined8 *)(in_RDI + 0x278) = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x179d32);
  std::ofstream::ofstream((void *)(in_RDI + 0x2a8),local_20,_S_bin);
  std::ios::exceptions
            ((int)in_RDI + 0x2a8 + (int)*(undefined8 *)(*(long *)(in_RDI + 0x2a8) + -0x18));
  lVar2 = gguf_find_key(*(undefined8 *)(in_RDI + 8),"split.count");
  if (-1 < lVar2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"split model is not yet supported");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_40 = local_18;
  local_48._M_current =
       (common_adapter_lora_info *)
       std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>::begin
                 ((vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *)
                  CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  this_01 = std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>::end
                      ((vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>
                        *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<common_adapter_lora_info_*,_std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>_>
                        *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       (__normal_iterator<common_adapter_lora_info_*,_std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>_>
                        *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    if (!bVar1) break;
    fname_00 = __gnu_cxx::
               __normal_iterator<common_adapter_lora_info_*,_std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>_>
               ::operator*(&local_48);
    std::__cxx11::string::string(local_78,(string *)fname_00);
    operator_new(0x250);
    file_input::file_input
              ((file_input *)this_01._M_current,&fname_00->path,in_stack_ffffffffffffffa4);
    std::unique_ptr<file_input,std::default_delete<file_input>>::
    unique_ptr<std::default_delete<file_input>,void>
              ((unique_ptr<file_input,_std::default_delete<file_input>_> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (pointer)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::unique_ptr<file_input,_std::default_delete<file_input>_>::get
              ((unique_ptr<file_input,_std::default_delete<file_input>_> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    check_metadata_lora(in_stack_000000a0,in_stack_00000098);
    std::
    vector<std::unique_ptr<file_input,_std::default_delete<file_input>_>,_std::allocator<std::unique_ptr<file_input,_std::default_delete<file_input>_>_>_>
    ::push_back((vector<std::unique_ptr<file_input,_std::default_delete<file_input>_>,_std::allocator<std::unique_ptr<file_input,_std::default_delete<file_input>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                (value_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::unique_ptr<file_input,_std::default_delete<file_input>_>::~unique_ptr
              ((unique_ptr<file_input,_std::default_delete<file_input>_> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    std::__cxx11::string::~string(local_78);
    __gnu_cxx::
    __normal_iterator<common_adapter_lora_info_*,_std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>_>
    ::operator++(&local_48);
  }
  uVar3 = gguf_init_empty();
  *(undefined8 *)(in_RDI + 0x298) = uVar3;
  gguf_get_n_tensors(*(undefined8 *)(in_RDI + 8));
  ggml_tensor_overhead();
  uVar3 = ggml_init();
  *(undefined8 *)(in_RDI + 0x2a0) = uVar3;
  uVar3 = ggml_backend_cpu_init();
  *(undefined8 *)(in_RDI + 0x270) = uVar3;
  uVar3 = ggml_backend_get_default_buffer_type(*(undefined8 *)(in_RDI + 0x270));
  uVar3 = ggml_gallocr_new(uVar3);
  *(undefined8 *)(in_RDI + 0x278) = uVar3;
  return;
}

Assistant:

lora_merge_ctx(
            std::string & base_fname,
            std::vector<common_adapter_lora_info> & lora_files,
            std::string & outfile,
            int n_threads) : base_model(base_fname, 0), n_threads(n_threads), fout(outfile, std::ios::binary) {
        fout.exceptions(std::ofstream::failbit); // fail fast on write errors

        if (gguf_find_key(base_model.ctx_gguf, LLM_KV_SPLIT_COUNT) >= 0) {
            throw std::runtime_error("split model is not yet supported");
        }

        for (auto & lora_inp : lora_files) {
            auto fname = lora_inp.path;
            auto scale = lora_inp.scale;
            std::unique_ptr<file_input> adapter(new file_input(fname, scale));
            check_metadata_lora(adapter.get());
            adapters.push_back(std::move(adapter));
        }

        ctx_out = gguf_init_empty();
        struct ggml_init_params params = {
            /*.mem_size   =*/ gguf_get_n_tensors(base_model.ctx_gguf)*ggml_tensor_overhead(),
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
        };
        ctx_out_ggml = ggml_init(params);
        backend = ggml_backend_cpu_init();
        allocr = ggml_gallocr_new(ggml_backend_get_default_buffer_type(backend));
    }